

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int fits_pixel_filter(PixelFilter *filter,int *status)

{
  fitsfile *fptr;
  fitsfile *pfVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  int bitpix;
  int ncards;
  int naxis;
  char *DEFAULT_TAGS [1];
  int more;
  long nelem;
  long naxes [5];
  uint local_308 [6];
  undefined8 local_2f0;
  int local_2e8;
  ParseData *local_2e0;
  char msg [256];
  ParseData lParse;
  char card [81];
  
  DEFAULT_TAGS[0] = "X";
  pcVar4 = getenv("DEBUG_PIXFILTER");
  DEBUG_PIXFILTER = (int)(pcVar4 != (char *)0x0);
  memset(local_308,0,0x90);
  if (*status != 0) {
    return *status;
  }
  if ((((filter->tag == (char **)0x0) || (pcVar7 = *filter->tag, pcVar7 == (char *)0x0)) ||
      (*pcVar7 == '\0')) && (filter->tag = DEFAULT_TAGS, pcVar4 != (char *)0x0)) {
    printf("using default tag \'%s\'\n");
  }
  fptr = filter->ofptr;
  pfVar1 = *filter->ifptr;
  lParse.pixFilter = filter;
  iVar2 = ffiprs(pfVar1,0,filter->expression,5,(int *)local_308,&nelem,&naxis,naxes,&lParse,status);
  uVar6 = local_308[0];
  if (iVar2 != 0) goto LAB_00129fa2;
  if ((int)local_308[0] < 0x10) {
    if (local_308[0] == 1) goto LAB_00129e63;
    if (local_308[0] == 0xe) {
      pcVar4 = "LOGICAL";
    }
    else {
LAB_00129e8a:
      *status = -1;
      ffpmsg("pixel_filter: unexpected result datatype");
      pcVar4 = "UNKNOWN?!";
    }
LAB_00129ea3:
    if (DEBUG_PIXFILTER != 0) {
      printf("result type is %s [%d]\n",pcVar4,(ulong)uVar6);
    }
  }
  else {
    if (local_308[0] != 0x10) {
      if (local_308[0] == 0x52) {
        pcVar4 = "DOUBLE";
      }
      else {
        if (local_308[0] != 0x29) goto LAB_00129e8a;
        pcVar4 = "LONG";
      }
      goto LAB_00129ea3;
    }
    *status = -1;
    ffpmsg("pixel_filter: cannot have string image");
LAB_00129e63:
    if (DEBUG_PIXFILTER != 0) {
      puts("hmm, image from bits?");
      pcVar4 = "BIT";
      goto LAB_00129ea3;
    }
  }
  if (*status != 0) goto LAB_00129fa2;
  iVar2 = ffgipr(pfVar1,5,&bitpix,&naxis,naxes,status);
  if (iVar2 == 0) {
    if (DEBUG_PIXFILTER != 0) {
      printf("input bitpix %d\n",(ulong)(uint)bitpix);
    }
    if (bitpix != -0x40 && uVar6 == 0x52) {
      bitpix = -0x20;
    }
    if (filter->bitpix != 0) {
      bitpix = filter->bitpix;
    }
    if (DEBUG_PIXFILTER != 0) {
      printf("output bitpix %d\n");
    }
    iVar2 = ffcrim(fptr,bitpix,naxis,naxes,status);
    if (iVar2 == 0) {
      iVar2 = ffghsp(pfVar1,&ncards,&more,status);
      if (iVar2 == 0) {
        if (0 < ncards) {
          uVar6 = 1;
          do {
            iVar2 = ffgrec(pfVar1,uVar6,card,status);
            if (iVar2 != 0) {
              snprintf(msg,0x100,"pixel_filter: unable to read keycard %d",(ulong)uVar6);
LAB_0012a099:
              pcVar4 = msg;
              goto LAB_00129f9d;
            }
            iVar2 = ffgkcl(card);
            if ((((iVar2 != 10) && (0xb < uVar6 || iVar2 != 0x82)) &&
                ((iVar2 != 0x28 && iVar2 != 0x1e || (-1 < bitpix)))) &&
               (iVar2 = ffprec(fptr,card,status), iVar2 != 0)) {
              snprintf(msg,0x100,"pixel_filter: unable to write keycard \'%s\' [%d]\n",card,
                       (ulong)(uint)*status);
              goto LAB_0012a099;
            }
            bVar8 = (int)uVar6 < ncards;
            uVar6 = uVar6 + 1;
          } while (bVar8);
        }
        if (bitpix < 8) {
          if (bitpix == -0x40) {
            local_308[0] = 0x52;
            bVar8 = true;
            uVar6 = 0x52;
          }
          else {
            if (bitpix != -0x20) {
LAB_0012a17a:
              snprintf(msg,0x100,"pixel_filter: unexpected output bitpix %d\n");
              ffpmsg(msg);
              *status = -1;
              goto LAB_00129fa2;
            }
            local_308[0] = 0x2a;
            bVar8 = true;
            uVar6 = 0x2a;
          }
        }
        else {
          if (bitpix == 0x20) {
            local_308[0] = 0x29;
            uVar6 = 0x29;
          }
          else if (bitpix == 0x10) {
            local_308[0] = 0x15;
            uVar6 = 0x15;
          }
          else {
            if (bitpix != 8) goto LAB_0012a17a;
            local_308[0] = 0xb;
            uVar6 = 0xb;
          }
          msg._0_8_ = filter->blank;
          bVar8 = true;
          if (msg._0_8_ == 0) {
            card[0] = '\0';
            card[1] = '\0';
            card[2] = '\0';
            card[3] = '\0';
            iVar2 = ffgkyj(pfVar1,"BLANK",(long *)msg,(char *)0x0,(int *)card);
            bVar8 = iVar2 == 0;
            if (!bVar8) {
              if (bitpix == 0x20) {
                msg[0] = '\0';
                msg[1] = '\0';
                msg[2] = '\0';
                msg[3] = -0x80;
                msg[4] = -1;
                msg[5] = -1;
                msg[6] = -1;
                msg[7] = -1;
              }
              else if (bitpix == 0x10) {
                msg[0] = '\0';
                msg[1] = -0x80;
                msg[2] = -1;
                msg[3] = -1;
                msg[4] = -1;
                msg[5] = -1;
                msg[6] = -1;
                msg[7] = -1;
              }
              else if (bitpix == 8) {
                msg[0] = -1;
                msg[1] = '\0';
                msg[2] = '\0';
                msg[3] = '\0';
                msg[4] = '\0';
                msg[5] = '\0';
                msg[6] = '\0';
                msg[7] = '\0';
              }
              else {
                printf("unhandled positive output BITPIX %d\n");
              }
            }
            filter->blank = msg._0_8_;
          }
          ffpnul(fptr,msg._0_8_,status);
          if (DEBUG_PIXFILTER != 0) {
            printf("using blank %ld\n",msg._0_8_);
          }
        }
        iVar2 = lParse.nCols;
        if (filter->keyword[0] == '\0') {
          iVar3 = fits_parser_allocateCol(&lParse,lParse.nCols,status);
          if (iVar3 != 0) goto LAB_00129fa2;
          lParse.nCols = lParse.nCols + 1;
          lVar5 = (long)iVar2;
          pfVar1 = filter->ofptr;
          lParse.colData[lVar5].fptr = pfVar1;
          lParse.colData[lVar5].iotype = 2;
          set_image_col_types(&lParse,pfVar1,"CREATED",bitpix,lParse.varData + lVar5,
                              lParse.colData + lVar5);
          local_2f0 = 0xffffffffffffffff;
          local_2e0 = &lParse;
          iVar2 = ffiter(lParse.nCols,lParse.colData,0,0,fits_parser_workfn,local_308,status);
          if (iVar2 == -1) {
            *status = 0;
          }
          else if (*status != 0) goto LAB_00129fa2;
          if (local_2e8 != 0) {
            if (!bVar8) {
              ffukyj(fptr,"BLANK",filter->blank,"NULL pixel value",status);
              if (*status != 0) {
                ffpmsg("pixel_filter: unable to write BLANK keyword");
              }
              if (DEBUG_PIXFILTER != 0) {
                puts("output has NULLs");
                printf("wrote blank [%d]\n",(ulong)(uint)*status);
              }
            }
            goto LAB_00129fa2;
          }
          if ((bitpix < 1) || (iVar2 = ffpnul(fptr,-0x4995cdd1,status), iVar2 == 0))
          goto LAB_00129fa2;
          pcVar4 = "pixel_filter: unable to reset imgnull";
        }
        else {
          pcVar4 = filter->keyword;
          pcVar7 = filter->comment;
          if (uVar6 < 0x29) {
            if (uVar6 == 0xe) {
              ffukyl(fptr,pcVar4,(int)lParse.Nodes[lParse.resultNode].value.data.log,pcVar7,status);
              goto LAB_00129fa2;
            }
            if (uVar6 == 0x10) {
              ffukys(fptr,pcVar4,&lParse.Nodes[lParse.resultNode].value.data.log,pcVar7,status);
              goto LAB_00129fa2;
            }
          }
          else {
            if (uVar6 == 0x29) {
              ffukyj(fptr,pcVar4,lParse.Nodes[lParse.resultNode].value.data.lng,pcVar7,status);
              goto LAB_00129fa2;
            }
            if (uVar6 == 0x52) {
              ffukyd(fptr,pcVar4,lParse.Nodes[lParse.resultNode].value.data.dbl,0xf,pcVar7,status);
              goto LAB_00129fa2;
            }
          }
          pcVar4 = msg;
          snprintf(pcVar4,0x100,"pixel_filter: unexpected constant result type [%d]\n",(ulong)uVar6)
          ;
        }
      }
      else {
        pcVar4 = "pixel_filter: unable to determine number of keycards";
      }
    }
    else {
      pcVar4 = "pixel_filter: unable to create output image";
    }
  }
  else {
    pcVar4 = "pixel_filter: unable to read input image parameters";
  }
LAB_00129f9d:
  ffpmsg(pcVar4);
LAB_00129fa2:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int fits_pixel_filter (PixelFilter * filter, int * status)
/* Evaluate an expression using the data in the input FITS file(s)          */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info = { 0 };
   int naxis, bitpix;
   long nelem, naxes[MAXDIMS];
   int col_cnt;
   Node *result;
   int datatype;
   fitsfile * infptr;
   fitsfile * outfptr;
   char * DEFAULT_TAGS[] = { "X" };
   char msg[256];
   int writeBlankKwd = 0;   /* write BLANK if any output nulls? */
   ParseData lParse;

   DEBUG_PIXFILTER = getenv("DEBUG_PIXFILTER") ? 1 : 0;

   memset(&Info, 0, sizeof(Info));   

   if (*status)
      return (*status);

   if (!filter->tag || !filter->tag[0] || !filter->tag[0][0]) {
      filter->tag = DEFAULT_TAGS;
      if (DEBUG_PIXFILTER)
         printf("using default tag '%s'\n", filter->tag[0]);
   }

   infptr = filter->ifptr[0];
   outfptr = filter->ofptr;
   lParse.pixFilter = filter;

   if (ffiprs(infptr, 0, filter->expression, MAXDIMS,
	      &Info.datatype, &nelem, &naxis, naxes, &lParse, status)) {
      goto CLEANUP;
   }


   if (nelem < 0) {
      nelem = -nelem;
   }

   {
      /* validate result type */
      const char * type = 0;
      switch (Info.datatype) {
         case TLOGICAL:  type = "LOGICAL"; break;
         case TLONG:     type = "LONG"; break;
         case TDOUBLE:   type = "DOUBLE"; break;
         case TSTRING:   type = "STRING";
                         *status = pERROR;
                         ffpmsg("pixel_filter: cannot have string image");
         case TBIT:      type = "BIT";
                         if (DEBUG_PIXFILTER)
                            printf("hmm, image from bits?\n");
                         break;
         default:       type = "UNKNOWN?!";
                        *status = pERROR;
                        ffpmsg("pixel_filter: unexpected result datatype");
      }
      if (DEBUG_PIXFILTER)
         printf("result type is %s [%d]\n", type, Info.datatype);
      if (*status)
         goto CLEANUP;
   }

   if (fits_get_img_param(infptr, MAXDIMS,
            &bitpix, &naxis, &naxes[0], status)) {
      ffpmsg("pixel_filter: unable to read input image parameters");
      goto CLEANUP;
   }

   if (DEBUG_PIXFILTER)
      printf("input bitpix %d\n", bitpix);

   if (Info.datatype == TDOUBLE) {
       /*  for floating point expressions, set the default output image to
           bitpix = -32 (float) unless the default is already a double */
       if (bitpix != DOUBLE_IMG)
           bitpix = FLOAT_IMG;
   }

   /* override output image bitpix if specified by caller */
   if (filter->bitpix)
      bitpix = filter->bitpix;
   if (DEBUG_PIXFILTER)
      printf("output bitpix %d\n", bitpix);

   if (fits_create_img(outfptr, bitpix, naxis, naxes, status)) {
      ffpmsg("pixel_filter: unable to create output image");
      goto CLEANUP;
   }

   /* transfer keycards */
   {
      int i, ncards, more;
      if (fits_get_hdrspace(infptr, &ncards, &more, status)) {
         ffpmsg("pixel_filter: unable to determine number of keycards");
         goto CLEANUP;
      }

      for (i = 1; i <= ncards; ++i) {

         int keyclass;
         char card[FLEN_CARD];

         if (fits_read_record(infptr, i, card, status)) {
            snprintf(msg, 256,"pixel_filter: unable to read keycard %d", i);
            ffpmsg(msg);
            goto CLEANUP;
         }

         keyclass = fits_get_keyclass(card);
         if (keyclass == TYP_STRUC_KEY) {
            /* output structure defined by fits_create_img */
         }
         else if (keyclass == TYP_COMM_KEY && i < 12) {
            /* assume this is one of the FITS standard comments */
         }
         else if (keyclass == TYP_NULL_KEY && bitpix < 0) {
            /* do not transfer BLANK to real output image */
         }
         else if (keyclass == TYP_SCAL_KEY && bitpix < 0) {
            /* do not transfer BZERO, BSCALE to real output image */
         }
         else if (fits_write_record(outfptr, card, status)) {
            snprintf(msg,256, "pixel_filter: unable to write keycard '%s' [%d]\n",
                        card, *status);
            ffpmsg(msg);
            goto CLEANUP;
         }
      }
   }

   switch (bitpix) {
      case BYTE_IMG: datatype = TLONG; Info.datatype = TBYTE; break;
      case SHORT_IMG: datatype = TLONG; Info.datatype = TSHORT; break;
      case LONG_IMG: datatype = TLONG; Info.datatype = TLONG; break;
      case FLOAT_IMG: datatype = TDOUBLE; Info.datatype = TFLOAT; break;
      case DOUBLE_IMG: datatype = TDOUBLE; Info.datatype = TDOUBLE; break;

      default:
           snprintf(msg, 256,"pixel_filter: unexpected output bitpix %d\n", bitpix);
           ffpmsg(msg);
           *status = pERROR;
           goto CLEANUP;
   }

   if (bitpix > 0) { /* arrange for NULLs in output */
      long nullVal = filter->blank;
      if (!filter->blank) {
         int tstatus = 0;
         if (fits_read_key_lng(infptr, "BLANK", &nullVal, 0, &tstatus)) {

            writeBlankKwd = 1;

            if (bitpix == BYTE_IMG)
                nullVal = UCHAR_MAX;
            else if (bitpix == SHORT_IMG)
                nullVal = SHRT_MIN;
            else if (bitpix == LONG_IMG) {
               if (sizeof(long) == 8 && sizeof(int) == 4)
                  nullVal = INT_MIN;
               else
                  nullVal = LONG_MIN;
            }
            else
                printf("unhandled positive output BITPIX %d\n", bitpix);
         }

         filter->blank = nullVal;
      }

      fits_set_imgnull(outfptr, filter->blank, status);
      if (DEBUG_PIXFILTER)
         printf("using blank %ld\n", nullVal);

   }

   if (!filter->keyword[0]) {
      iteratorCol * colIter;
      DataInfo * varInfo;

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/
      col_cnt = lParse.nCols;
      if (fits_parser_allocateCol(&lParse, col_cnt, status))
         goto CLEANUP;
      lParse.nCols++;

      colIter = &lParse.colData[col_cnt];
      colIter->fptr = filter->ofptr;
      colIter->iotype = OutputCol;
      varInfo = &lParse.varData[col_cnt];
      set_image_col_types(&lParse, colIter->fptr, "CREATED", bitpix, varInfo, colIter);

      Info.maxRows = -1;
      Info.parseData = &lParse;

      if (ffiter(lParse.nCols, lParse.colData, 0,
                     0, fits_parser_workfn, &Info, status) == -1)
            *status = 0;
      else if (*status)
         goto CLEANUP;

      if (Info.anyNull) {
         if (writeBlankKwd) {
            fits_update_key_lng(outfptr, "BLANK", filter->blank, "NULL pixel value", status);
            if (*status)
                ffpmsg("pixel_filter: unable to write BLANK keyword");
            if (DEBUG_PIXFILTER) {
                printf("output has NULLs\n");
                printf("wrote blank [%d]\n", *status);
            }
         }
      }
      else if (bitpix > 0) /* never used a null */
         if (fits_set_imgnull(outfptr, -1234554321, status))
            ffpmsg("pixel_filter: unable to reset imgnull");
   }
   else {

      /* Put constant result into keyword */
      char * parName = filter->keyword;
      char * parInfo = filter->comment;

      result  = lParse.Nodes + lParse.resultNode;
      switch (Info.datatype) {
      case TDOUBLE:
         ffukyd(outfptr, parName, result->value.data.dbl, 15, parInfo, status);
         break;
      case TLONG:
         ffukyj(outfptr, parName, result->value.data.lng, parInfo, status);
         break;
      case TLOGICAL:
         ffukyl(outfptr, parName, result->value.data.log, parInfo, status);
         break;
      case TBIT:
      case TSTRING:
         ffukys(outfptr, parName, result->value.data.str, parInfo, status);
         break;
      default:
         snprintf(msg, 256,"pixel_filter: unexpected constant result type [%d]\n",
                Info.datatype);
         ffpmsg(msg);
      }
   }

CLEANUP:
   ffcprs(&lParse);
   return (*status);
}